

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O2

bool __thiscall
Memory::HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>::
IntegrateBlock(HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
               *this,char *blockAddress,PageSegment *segment,Recycler *recycler)

{
  size_t *psVar1;
  uint32 *puVar2;
  BOOL BVar3;
  uint uVar4;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *heapBlock;
  uint uVar5;
  
  heapBlock = GetUnusedHeapBlock(this);
  if (heapBlock != (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    BVar3 = SmallHeapBlockT<SmallAllocationBlockAttributes>::SetPage
                      ((SmallHeapBlockT<SmallAllocationBlockAttributes> *)heapBlock,blockAddress,
                       segment,recycler);
    if (BVar3 != 0) {
      (heapBlock->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
      super_SmallHeapBlockT<SmallAllocationBlockAttributes>.next =
           (SmallHeapBlockT<SmallAllocationBlockAttributes> *)this->fullBlockList;
      this->fullBlockList = heapBlock;
      puVar2 = &(this->super_HeapBucket).heapBlockCount;
      *puVar2 = *puVar2 + 1;
      uVar4 = SmallHeapBlockT<SmallAllocationBlockAttributes>::GetAndClearLastFreeCount
                        ((SmallHeapBlockT<SmallAllocationBlockAttributes> *)heapBlock);
      uVar5 = (uint)(heapBlock->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
                    super_SmallHeapBlockT<SmallAllocationBlockAttributes>.objectSize;
      psVar1 = &(recycler->autoHeap).uncollectedAllocBytes;
      *psVar1 = *psVar1 + (ulong)(uVar4 * uVar5);
      RecyclerMemoryTracking::ReportAllocation
                (recycler,blockAddress,
                 (ulong)((heapBlock->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
                         super_SmallHeapBlockT<SmallAllocationBlockAttributes>.objectCount * uVar5))
      ;
      (heapBlock->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
      super_SmallHeapBlockT<SmallAllocationBlockAttributes>.isIntegratedBlock = true;
      return true;
    }
    FreeHeapBlock(this,heapBlock);
  }
  return false;
}

Assistant:

bool
HeapBucketT<TBlockType>::IntegrateBlock(char * blockAddress, PageSegment * segment, Recycler * recycler)
{
    // Add a new heap block
    TBlockType * heapBlock = GetUnusedHeapBlock();
    if (heapBlock == nullptr)
    {
        return false;
    }

    // TODO: Consider supporting guard pages for this codepath
    if (!heapBlock->SetPage(blockAddress, segment, recycler))
    {
        FreeHeapBlock(heapBlock);
        return false;
    }

    heapBlock->SetNextBlock(this->fullBlockList);
    this->fullBlockList = heapBlock;

#if defined(RECYCLER_SLOW_CHECK_ENABLED) || ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    this->heapBlockCount++;
#endif

    recycler->autoHeap.uncollectedAllocBytes += heapBlock->GetAndClearLastFreeCount() * heapBlock->GetObjectSize();
    RecyclerMemoryTracking::ReportAllocation(recycler, blockAddress, heapBlock->GetObjectSize() * heapBlock->GetObjectCount());
    RECYCLER_PERF_COUNTER_ADD(LiveObject,heapBlock->GetObjectCount());
    RECYCLER_PERF_COUNTER_ADD(LiveObjectSize, heapBlock->GetObjectSize() * heapBlock->GetObjectCount());

    if (heapBlock->IsLargeHeapBlock())
    {
        RECYCLER_PERF_COUNTER_ADD(LargeHeapBlockLiveObject,heapBlock->GetObjectCount());
        RECYCLER_PERF_COUNTER_ADD(LargeHeapBlockLiveObjectSize, heapBlock->GetObjectSize() * heapBlock->GetObjectCount());
    }
    else
    {
        RECYCLER_PERF_COUNTER_ADD(SmallHeapBlockLiveObject,heapBlock->GetObjectCount());
        RECYCLER_PERF_COUNTER_ADD(SmallHeapBlockLiveObjectSize, heapBlock->GetObjectSize() * heapBlock->GetObjectCount());
    }

#if DBG
    heapBlock->SetIsIntegratedBlock();
#endif

    return true;
}